

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssim_sse2.c
# Opt level: O0

uint32_t AccumulateSSE_SSE2(uint8_t *src1,uint8_t *src2,int len)

{
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  int iVar1;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int32_t diff;
  __m128i sum2;
  __m128i b1;
  __m128i a1;
  __m128i b0;
  __m128i a0;
  __m128i sum;
  __m128i sum1;
  int32_t tmp [4];
  int limit;
  uint32_t sse2;
  int i;
  __m128i *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  longlong in_stack_fffffffffffffea8;
  longlong in_stack_fffffffffffffeb0;
  longlong in_stack_fffffffffffffeb8;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  uint32_t local_d4;
  int local_d0;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int local_38;
  int iStack_34;
  int iStack_30;
  int iStack_2c;
  
  local_d0 = 0;
  local_d4 = 0;
  if (0xf < in_EDX) {
    local_108 = 0;
    iStack_104 = 0;
    iStack_100 = 0;
    iStack_fc = 0;
    local_d0 = 0x10;
    while( true ) {
      local_38 = (int)local_f8;
      iStack_34 = (int)((ulong)local_f8 >> 0x20);
      iStack_30 = (int)uStack_f0;
      iStack_2c = (int)((ulong)uStack_f0 >> 0x20);
      if (in_EDX + -0x20 < local_d0) break;
      in_stack_fffffffffffffeb8 = *(longlong *)(in_RSI + local_d0);
      a[1] = in_stack_fffffffffffffeb8;
      a[0] = in_stack_fffffffffffffeb0;
      b[0]._4_4_ = in_stack_fffffffffffffea4;
      b[0]._0_4_ = in_stack_fffffffffffffea0;
      b[1] = in_stack_fffffffffffffea8;
      SubtractAndSquare_SSE2(a,b,in_stack_fffffffffffffe98);
      local_d0 = local_d0 + 0x20;
      a_00[1] = in_stack_fffffffffffffeb8;
      a_00[0] = in_stack_fffffffffffffeb0;
      b_00[0]._4_4_ = in_stack_fffffffffffffea4;
      b_00[0]._0_4_ = in_stack_fffffffffffffea0;
      b_00[1] = in_stack_fffffffffffffea8;
      SubtractAndSquare_SSE2(a_00,b_00,in_stack_fffffffffffffe98);
      local_58 = (int)in_stack_fffffffffffffea8;
      iStack_54 = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
      iStack_50 = (int)in_stack_fffffffffffffeb0;
      iStack_4c = (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
      local_108 = local_108 + local_38 + local_58;
      iStack_104 = iStack_104 + iStack_34 + iStack_54;
      iStack_100 = iStack_100 + iStack_30 + iStack_50;
      iStack_fc = iStack_fc + iStack_2c + iStack_4c;
    }
    a_01[1] = in_stack_fffffffffffffeb8;
    a_01[0] = in_stack_fffffffffffffeb0;
    b_01[0]._4_4_ = in_stack_fffffffffffffea4;
    b_01[0]._0_4_ = in_stack_fffffffffffffea0;
    b_01[1] = in_stack_fffffffffffffea8;
    SubtractAndSquare_SSE2(a_01,b_01,in_stack_fffffffffffffe98);
    local_d4 = iStack_fc + iStack_2c + iStack_100 + iStack_30 + iStack_104 + iStack_34 +
               local_108 + local_38;
  }
  for (; local_d0 < in_EDX; local_d0 = local_d0 + 1) {
    iVar1 = (uint)*(byte *)(in_RDI + local_d0) - (uint)*(byte *)(in_RSI + local_d0);
    local_d4 = iVar1 * iVar1 + local_d4;
  }
  return local_d4;
}

Assistant:

static uint32_t AccumulateSSE_SSE2(const uint8_t* src1,
                                   const uint8_t* src2, int len) {
  int i = 0;
  uint32_t sse2 = 0;
  if (len >= 16) {
    const int limit = len - 32;
    int32_t tmp[4];
    __m128i sum1;
    __m128i sum = _mm_setzero_si128();
    __m128i a0 = _mm_loadu_si128((const __m128i*)&src1[i]);
    __m128i b0 = _mm_loadu_si128((const __m128i*)&src2[i]);
    i += 16;
    while (i <= limit) {
      const __m128i a1 = _mm_loadu_si128((const __m128i*)&src1[i]);
      const __m128i b1 = _mm_loadu_si128((const __m128i*)&src2[i]);
      __m128i sum2;
      i += 16;
      SubtractAndSquare_SSE2(a0, b0, &sum1);
      sum = _mm_add_epi32(sum, sum1);
      a0 = _mm_loadu_si128((const __m128i*)&src1[i]);
      b0 = _mm_loadu_si128((const __m128i*)&src2[i]);
      i += 16;
      SubtractAndSquare_SSE2(a1, b1, &sum2);
      sum = _mm_add_epi32(sum, sum2);
    }
    SubtractAndSquare_SSE2(a0, b0, &sum1);
    sum = _mm_add_epi32(sum, sum1);
    _mm_storeu_si128((__m128i*)tmp, sum);
    sse2 += (tmp[3] + tmp[2] + tmp[1] + tmp[0]);
  }

  for (; i < len; ++i) {
    const int32_t diff = src1[i] - src2[i];
    sse2 += diff * diff;
  }
  return sse2;
}